

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leds.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char cVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  bool bVar5;
  uint8_t power_led;
  bool enable_spot_led;
  bool enable_dock_led;
  bool enable_debris_led;
  bool enable_check_robot_led;
  char digit_buffer [5];
  int baud;
  RobotModel model;
  string port;
  Create robot;
  byte local_1ed;
  uchar local_1ec;
  byte local_1eb;
  byte local_1ea;
  byte local_1e9;
  byte local_1e8;
  undefined1 local_1e7;
  uchar local_1e6;
  uchar local_1e5;
  uchar local_1e4 [7];
  allocator local_1dd;
  undefined4 local_1dc;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  char *local_1c0 [2];
  char local_1b0 [16];
  undefined1 *local_1a0 [2];
  undefined1 local_190 [16];
  Create local_180 [336];
  
  local_1c8 = ___cxa_end_catch;
  local_1d8 = CONCAT44(create::RobotModel::CREATE_2._4_4_,(undefined4)create::RobotModel::CREATE_2);
  uStack_1d0 = CONCAT44(uRam000000000010911c,_Init);
  local_1c0[0] = local_1b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c0,"/dev/ttyUSB0","");
  local_1dc = 0x1c200;
  if (argc < 2) {
    bVar5 = false;
  }
  else {
    std::__cxx11::string::string((string *)local_1a0,argv[1],&local_1dd);
    iVar2 = std::__cxx11::string::compare((char *)local_1a0);
    bVar5 = iVar2 == 0;
    if (local_1a0[0] != local_190) {
      operator_delete(local_1a0[0]);
    }
  }
  if (bVar5) {
    local_1c8 = ___ostream_insert<char,std::char_traits<char>>;
    local_1d8 = create::RobotModel::CREATE_1;
    uStack_1d0 = _enableDebrisLED;
    local_1dc = 0xe100;
    pcVar4 = "Running driver for Create 1";
  }
  else {
    pcVar4 = "Running driver for Create 2";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar4,0x1b);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
  create::Create::Create(local_180,1);
  cVar1 = create::Create::connect((string *)local_180,(int *)local_1c0);
  if (cVar1 != '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Connected to robot",0x12);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    local_1e4[0] = '\x03';
    local_1e4[1] = '\0';
    local_1e4[2] = '\0';
    local_1e4[3] = '\0';
    create::Create::setMode((CreateMode *)local_180);
    local_1e8 = 1;
    local_1e9 = 0;
    local_1ea = 1;
    local_1eb = 0;
    local_1ed = 0;
    do {
      create::Create::enableCheckRobotLED((bool *)local_180);
      create::Create::enableDebrisLED((bool *)local_180);
      create::Create::enableDockLED((bool *)local_180);
      create::Create::enableSpotLED((bool *)local_180);
      local_1ec = 0xff;
      create::Create::setPowerLED((uchar *)local_180,&local_1ed);
      iVar2 = sprintf((char *)local_1e4,"%d",(ulong)local_1ed);
      if (iVar2 < 4) {
        memset(local_1e4 + iVar2,0x20,(ulong)(3 - iVar2) + 1);
      }
      local_1ec = local_1e4[0];
      local_1e5 = local_1e4[1];
      local_1e6 = local_1e4[2];
      local_1e7 = local_1e4[3];
      create::Create::setDigitsASCII((uchar *)local_180,&local_1ec,&local_1e5,&local_1e6);
      local_1e8 = local_1e8 ^ 1;
      local_1e9 = local_1e9 ^ 1;
      local_1ea = local_1ea ^ 1;
      local_1eb = local_1eb ^ 1;
      local_1ed = local_1ed + 1;
      usleep(250000);
    } while( true );
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Failed to connect to robot on port ",0x23);
  pcVar4 = local_1c0[0];
  if (local_1c0[0] == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1090f8);
  }
  else {
    sVar3 = strlen(local_1c0[0]);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar4,sVar3);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
  create::Create::~Create(local_180);
  if (local_1c0[0] != local_1b0) {
    operator_delete(local_1c0[0]);
  }
  return 1;
}

Assistant:

int main(int argc, char** argv) {
  // Select robot. Assume Create 2 unless argument says otherwise
  create::RobotModel model = create::RobotModel::CREATE_2;
  std::string port = "/dev/ttyUSB0";
  int baud = 115200;
  if (argc > 1 && std::string(argv[1]) == "create1") {
    model = create::RobotModel::CREATE_1;
    baud = 57600;
    std::cout << "Running driver for Create 1" << std::endl;
  }
  else {
    std::cout << "Running driver for Create 2" << std::endl;
  }

  // Construct robot object
  create::Create robot(model);

  // Connect to robot
  if (robot.connect(port, baud))
    std::cout << "Connected to robot" << std::endl;
  else {
    std::cout << "Failed to connect to robot on port " << port.c_str() << std::endl;
    return 1;
  }

  // Switch to Full mode
  robot.setMode(create::MODE_FULL);

  bool enable_check_robot_led = true;
  bool enable_debris_led = false;
  bool enable_dock_led = true;
  bool enable_spot_led = false;
  uint8_t power_led = 0;
  char digit_buffer[5];

  while (true) {
    // Set LEDs
    robot.enableCheckRobotLED(enable_check_robot_led);
    robot.enableDebrisLED(enable_debris_led);
    robot.enableDockLED(enable_dock_led);
    robot.enableSpotLED(enable_spot_led);
    robot.setPowerLED(power_led);

    // Set 7-segment displays
    const int len = sprintf(digit_buffer, "%d", power_led);
    for (int i = len; i < 4; i++) digit_buffer[i] = ' ';
    robot.setDigitsASCII(digit_buffer[0], digit_buffer[1], digit_buffer[2], digit_buffer[3]);

    // Update LED values
    enable_check_robot_led = !enable_check_robot_led;
    enable_debris_led = !enable_debris_led;
    enable_dock_led = !enable_dock_led;
    enable_spot_led = !enable_spot_led;
    power_led++;

    usleep(250000);  // 5 Hz
  }

  return 0;
}